

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

double __thiscall Fl_Input_::expandpos(Fl_Input_ *this,char *p,char *e,char *buf,int *returnn)

{
  byte c;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double extraout_XMM0_Qa;
  
  if (((this->super_Fl_Widget).type_ & 7) == 5) {
    if (p < e) {
      uVar5 = 0;
      do {
        iVar1 = fl_utf8len(*p);
        iVar2 = 0;
        if (0 < iVar1) {
          iVar2 = l_secret;
        }
        uVar5 = uVar5 + iVar2;
        p = p + iVar1;
      } while (p < e);
      goto LAB_001ba6d7;
    }
  }
  else if (p < e) {
    uVar5 = 0;
    uVar4 = 0;
    do {
      c = *p;
      if (c < 0x20 || c == 0x7f) {
        if ((c == 9) && (((this->super_Fl_Widget).type_ & 7) == 4)) {
          uVar3 = uVar4 + 7;
          if (-1 < (int)uVar4) {
            uVar3 = uVar4;
          }
          uVar5 = uVar5 + ((uVar3 & 0xfffffff8) - uVar4) + 8;
          uVar4 = uVar3 & 0xfffffff8 | 7;
        }
        else {
          uVar5 = uVar5 + 2;
        }
      }
      else {
        uVar5 = uVar5 + 1;
      }
      iVar2 = fl_utf8len(c);
      uVar4 = uVar4 + (0 < iVar2);
      p = (char *)((byte *)p + 1);
    } while (p != e);
    goto LAB_001ba6d7;
  }
  uVar5 = 0;
LAB_001ba6d7:
  if (returnn != (int *)0x0) {
    *returnn = uVar5;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
            (fl_graphics_driver,buf,(ulong)uVar5);
  return extraout_XMM0_Qa;
}

Assistant:

double Fl_Input_::expandpos(
  const char* p,	// real string
  const char* e,	// pointer into real string
  const char* buf,	// conversion of real string by expand()
  int* returnn		// return offset into buf here
) const {
  int n = 0;
  int chr = 0;
  int l;
  if (input_type()==FL_SECRET_INPUT) {
    while (p<e) {
      l = fl_utf8len((char)p[0]);
      if (l >= 1) n += l_secret;
      p += l;
    }
  } else while (p<e) {
    int c = *p & 255;
    if (c < ' ' || c == 127) {
      if (c == '\t' && input_type()==FL_MULTILINE_INPUT) {
         n += 8-(chr%8);
         chr += 7-(chr%8);
      } else n += 2;
    } else {
      n++;
    }
    chr += fl_utf8len((char)p[0]) >= 1;
    p++;
  }
  if (returnn) *returnn = n;
  return fl_width(buf, n);
}